

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_sendmsg(int s,nn_msghdr *msghdr,int flags)

{
  int *piVar1;
  ulong uVar2;
  void *pvVar3;
  long *in_RSI;
  size_t clen;
  uchar *ptr;
  nn_sock *sock;
  nn_cmsghdr *cmsg;
  int nnmsg;
  void *chunk;
  nn_msg msg;
  nn_iovec *iov;
  int i;
  size_t spsz;
  size_t sz;
  int rc;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff30;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff38;
  int name;
  nn_sock *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  nn_msg *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int iVar5;
  nn_chunkref local_98;
  nn_chunkref nStack_78;
  nn_chunkref nStack_58;
  long *local_38;
  int local_2c;
  nn_fsm_fn local_28;
  ulong local_20;
  int local_18;
  long *local_10;
  
  local_10 = in_RSI;
  local_18 = nn_global_hold_socket
                       ((nn_sock **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff2c);
  if (local_18 < 0) {
    iVar5 = -local_18;
    piVar1 = __errno_location();
    *piVar1 = iVar5;
    return -1;
  }
  if (local_10 == (long *)0x0) {
    local_18 = -0x16;
  }
  else if ((int)local_10[1] < 0) {
    local_18 = -0x5a;
  }
  else {
    if (((int)local_10[1] == 1) && (*(long *)(*local_10 + 8) == -1)) {
      if (**(long **)*local_10 == 0) {
        local_18 = -0xe;
        goto LAB_001ce35a;
      }
      local_20 = nn_chunk_size((void *)0x1cdef2);
      nn_msg_init_chunk((nn_msg *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        (void *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      iVar5 = 1;
    }
    else {
      local_20 = 0;
      for (local_2c = 0; local_2c != (int)local_10[1]; local_2c = local_2c + 1) {
        local_38 = (long *)(*local_10 + (long)local_2c * 0x10);
        if (local_38[1] == -1) {
          local_18 = -0x16;
          goto LAB_001ce35a;
        }
        uVar4 = in_stack_ffffffffffffff30 & 0xffffff;
        if (*local_38 == 0) {
          uVar4 = CONCAT13(local_38[1] != 0,(int3)in_stack_ffffffffffffff30);
        }
        if ((char)(uVar4 >> 0x18) != '\0') {
          local_18 = -0xe;
          goto LAB_001ce35a;
        }
        if (local_20 + local_38[1] < local_20) {
          local_18 = -0x16;
          goto LAB_001ce35a;
        }
        local_20 = local_38[1] + local_20;
        in_stack_ffffffffffffff30 = uVar4;
      }
      nn_msg_init((nn_msg *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      local_20 = 0;
      for (local_2c = 0; local_2c != (int)local_10[1]; local_2c = local_2c + 1) {
        local_38 = (long *)(*local_10 + (long)local_2c * 0x10);
        pvVar3 = nn_chunkref_data(&nStack_58);
        memcpy((void *)((long)pvVar3 + local_20),(void *)*local_38,local_38[1]);
        local_20 = local_38[1] + local_20;
      }
      iVar5 = 0;
    }
    name = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    if (local_10[2] != 0) {
      if (local_10[3] == -1) {
        pvVar3 = *(void **)local_10[2];
        nn_chunkref_term((nn_chunkref *)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        nn_chunkref_init_chunk(&nStack_78,pvVar3);
      }
      else {
        nn_chunkref_term((nn_chunkref *)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        nn_chunkref_init(&in_stack_ffffffffffffff50->sphdr,
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar3 = nn_chunkref_data(&nStack_78);
        memcpy(pvVar3,(void *)local_10[2],local_10[3]);
      }
      in_stack_ffffffffffffff50 =
           (nn_msg *)
           nn_cmsg_nxthdr_((nn_msghdr *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                           (nn_cmsghdr *)in_stack_ffffffffffffff40);
      while (name = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
            in_stack_ffffffffffffff50 != (nn_msg *)0x0) {
        if ((*(int *)((long)&(in_stack_ffffffffffffff50->sphdr).u + 8) == 1) &&
           (*(int *)((long)&(in_stack_ffffffffffffff50->sphdr).u + 0xc) == 1)) {
          in_stack_ffffffffffffff40 =
               (nn_sock *)((long)&(in_stack_ffffffffffffff50->sphdr).u + 0x10);
          pvVar3 = (in_stack_ffffffffffffff50->sphdr).u.unused;
          uVar2 = (long)pvVar3 - 0x10;
          if ((8 < uVar2) &&
             (local_28 = (in_stack_ffffffffffffff40->fsm).fn,
             local_28 <= (nn_fsm_fn)((long)pvVar3 - 0x18U))) {
            nn_chunkref_term((nn_chunkref *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
            nn_chunkref_init(&in_stack_ffffffffffffff50->sphdr,
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            pvVar3 = nn_chunkref_data(&local_98);
            memcpy(pvVar3,&(in_stack_ffffffffffffff40->fsm).shutdown_fn,(size_t)local_28);
          }
          name = (int)(uVar2 >> 0x20);
          break;
        }
        in_stack_ffffffffffffff50 =
             (nn_msg *)
             nn_cmsg_nxthdr_((nn_msghdr *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                             (nn_cmsghdr *)in_stack_ffffffffffffff40);
      }
    }
    local_18 = nn_sock_send((nn_sock *)CONCAT44(iVar5,in_stack_ffffffffffffff58),
                            in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    if (-1 < local_18) {
      nn_sock_stat_increment
                (in_stack_ffffffffffffff40,name,
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      nn_sock_stat_increment
                (in_stack_ffffffffffffff40,name,
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      nn_global_rele_socket((nn_sock *)0x1ce349);
      return (int)local_20;
    }
    if (iVar5 != 0) {
      nn_chunkref_init(&in_stack_ffffffffffffff50->sphdr,
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    nn_msg_term((nn_msg *)0x1ce312);
  }
LAB_001ce35a:
  nn_global_rele_socket((nn_sock *)0x1ce364);
  iVar5 = -local_18;
  piVar1 = __errno_location();
  *piVar1 = iVar5;
  return -1;
}

Assistant:

int nn_sendmsg (int s, const struct nn_msghdr *msghdr, int flags)
{
    int rc;
    size_t sz;
    size_t spsz;
    int i;
    struct nn_iovec *iov;
    struct nn_msg msg;
    void *chunk;
    int nnmsg;
    struct nn_cmsghdr *cmsg;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    if (nn_slow (!msghdr)) {
        rc = -EINVAL;
        goto fail;
    }

    if (nn_slow (msghdr->msg_iovlen < 0)) {
        rc = -EMSGSIZE;
        goto fail;
    }

    if (msghdr->msg_iovlen == 1 && msghdr->msg_iov [0].iov_len == NN_MSG) {
        chunk = *(void**) msghdr->msg_iov [0].iov_base;
        if (nn_slow (chunk == NULL)) {
            rc = -EFAULT;
            goto fail;
        }
        sz = nn_chunk_size (chunk);
        nn_msg_init_chunk (&msg, chunk);
        nnmsg = 1;
    }
    else {

        /*  Compute the total size of the message. */
        sz = 0;
        for (i = 0; i != msghdr->msg_iovlen; ++i) {
            iov = &msghdr->msg_iov [i];
            if (nn_slow (iov->iov_len == NN_MSG)) {
               rc = -EINVAL;
               goto fail;
            }
            if (nn_slow (!iov->iov_base && iov->iov_len)) {
                rc = -EFAULT;
                goto fail;
            }
            if (nn_slow (sz + iov->iov_len < sz)) {
                rc = -EINVAL;
                goto fail;
            }
            sz += iov->iov_len;
        }

        /*  Create a message object from the supplied scatter array. */
        nn_msg_init (&msg, sz);
        sz = 0;
        for (i = 0; i != msghdr->msg_iovlen; ++i) {
            iov = &msghdr->msg_iov [i];
            memcpy (((uint8_t*) nn_chunkref_data (&msg.body)) + sz,
                iov->iov_base, iov->iov_len);
            sz += iov->iov_len;
        }

        nnmsg = 0;
    }

    /*  Add ancillary data to the message. */
    if (msghdr->msg_control) {

        /*  Copy all headers. */
        /*  TODO: SP_HDR should not be copied here! */
        if (msghdr->msg_controllen == NN_MSG) {
            chunk = *((void**) msghdr->msg_control);
            nn_chunkref_term (&msg.hdrs);
            nn_chunkref_init_chunk (&msg.hdrs, chunk);
        }
        else {
            nn_chunkref_term (&msg.hdrs);
            nn_chunkref_init (&msg.hdrs, msghdr->msg_controllen);
            memcpy (nn_chunkref_data (&msg.hdrs),
                msghdr->msg_control, msghdr->msg_controllen);
        }

        /* Search for SP_HDR property. */
        cmsg = NN_CMSG_FIRSTHDR (msghdr);
        while (cmsg) {
            if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR) {
                unsigned char *ptr = NN_CMSG_DATA (cmsg);
                size_t clen = cmsg->cmsg_len - NN_CMSG_SPACE (0);
                if (clen > sizeof (size_t)) {
                    spsz = *(size_t *)(void *)ptr;
                    if (spsz <= (clen - sizeof (size_t))) {
                        /*  Copy body of SP_HDR property into 'sphdr'. */
                        nn_chunkref_term (&msg.sphdr);
                        nn_chunkref_init (&msg.sphdr, spsz);
                         memcpy (nn_chunkref_data (&msg.sphdr),
                             ptr + sizeof (size_t), spsz);
                    }
                }
                break;
            }
            cmsg = NN_CMSG_NXTHDR (msghdr, cmsg);
        }
    }

    /*  Send it further down the stack. */
    rc = nn_sock_send (sock, &msg, flags);
    if (nn_slow (rc < 0)) {

        /*  If we are dealing with user-supplied buffer, detach it from
            the message object. */
        if (nnmsg)
            nn_chunkref_init (&msg.body, 0);

        nn_msg_term (&msg);
        goto fail;
    }

    /*  Adjust the statistics. */
    nn_sock_stat_increment (sock, NN_STAT_MESSAGES_SENT, 1);
    nn_sock_stat_increment (sock, NN_STAT_BYTES_SENT, sz);

    nn_global_rele_socket (sock);

    return (int) sz;

fail:
    nn_global_rele_socket (sock);

    errno = -rc;
    return -1;
}